

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O3

string * __thiscall
upb::generator::(anonymous_namespace)::SourceFilename_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FileDefPtr file)

{
  long lVar1;
  char *__s;
  generator *this_00;
  long *plVar2;
  string *extraout_RAX;
  string *psVar3;
  char *in_RCX;
  size_type *psVar4;
  string_view fname;
  string local_38;
  
  __s = upb_FileDef_Name((upb_FileDef *)this);
  this_00 = (generator *)strlen(__s);
  fname._M_str = in_RCX;
  fname._M_len = (size_t)__s;
  StripExtension_abi_cxx11_(&local_38,this_00,fname);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_38);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar4) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  psVar3 = (string *)&local_38.field_2;
  if ((string *)local_38._M_dataplus._M_p != psVar3) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    psVar3 = extraout_RAX;
  }
  return psVar3;
}

Assistant:

std::string SourceFilename(upb::FileDefPtr file) {
  return StripExtension(file.name()) + ".upb.c";
}